

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  iterator __position;
  bool bVar2;
  entry_type eVar3;
  int32_t iVar4;
  int iVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  uint32_t h;
  element_type *peVar8;
  int32_t iVar9;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  uint32_t local_7c;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  element_type *local_38;
  
  local_78._0_8_ = (__buckets_ptr)0x0;
  local_78._8_8_ = (int *)0x0;
  local_78._16_8_ = (_Hash_node_base *)0x0;
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0x10] = 0;
  peVar8 = (element_type *)this;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  iVar9 = 0;
  local_78._24_8_ = words;
  local_38 = (element_type *)labels;
  do {
    do {
      bVar2 = readWord((Dictionary *)peVar8,in,(string *)local_58);
      if (!bVar2) goto LAB_0012899e;
      h = 0x811c9dc5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          h = ((int)*(char *)((long)&p_Var7->_vptr__Sp_counted_base +
                             (long)(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_58._0_8_) ^ h) * 0x1000193;
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&p_Var7->_vptr__Sp_counted_base + 1);
        } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ != p_Var7);
      }
      iVar4 = find(this,(string *)local_58,h);
      iVar4 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if (iVar4 < 0) {
        peVar8 = (element_type *)local_58;
        lVar6 = std::__cxx11::string::find
                          ((char *)local_58,
                           (ulong)(((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->label)._M_dataplus._M_p,0);
        eVar3 = lVar6 == 0;
      }
      else {
        peVar8 = (element_type *)this;
        eVar3 = getType(this,iVar4);
      }
      if (eVar3 == word) {
        peVar8 = (element_type *)this;
        addSubwords(this,(vector<int,_std::allocator<int>_> *)local_78._24_8_,(string *)local_58,
                    iVar4);
        local_7c = h;
        if (local_78._8_8_ == local_78._16_8_) {
          peVar8 = (element_type *)local_78;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)peVar8,(iterator)local_78._8_8_,
                     (int *)&local_7c);
        }
        else {
          *(uint32_t *)local_78._8_8_ = h;
          local_78._8_8_ = local_78._8_8_ + 4;
        }
      }
      else if ((-1 < iVar4) && (eVar3 == label)) {
        local_7c = iVar4 - this->nwords_;
        __position._M_current =
             (int *)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    &(local_38->manualArgs_)._M_h._M_bucket_count)->_M_pi;
        peVar8 = local_38;
        if ((_Hash_node_base *)__position._M_current ==
            (local_38->manualArgs_)._M_h._M_before_begin._M_nxt) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_38,__position,(int *)&local_7c);
        }
        else {
          *__position._M_current = local_7c;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          &(local_38->manualArgs_)._M_h._M_bucket_count)->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__position._M_current + 1);
        }
      }
      iVar9 = iVar9 + 1;
    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ != DAT_0014e2b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    peVar8 = (element_type *)local_58._0_8_;
    iVar5 = bcmp((void *)local_58._0_8_,EOS_abi_cxx11_,local_58._8_8_);
  } while (iVar5 != 0);
LAB_0012899e:
  addWordNgrams(this,(vector<int,_std::allocator<int>_> *)local_78._24_8_,
                (vector<int,_std::allocator<int>_> *)local_78,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if ((element_type *)local_58._0_8_ != (element_type *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((__buckets_ptr)local_78._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  return iVar9;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}